

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O1

void __thiscall spdlog::logger::logger(logger *this,string *logger_name,sinks_init_list sinks_list)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 local_61;
  char *local_60;
  size_type local_58;
  char local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  anon_class_8_1_8991fb9c local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pcVar2 = (logger_name->_M_dataplus)._M_p;
  local_60 = &local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + logger_name->_M_string_length);
  this->_vptr_logger = (_func_int **)&PTR__logger_001b0820;
  paVar1 = &(this->_name).field_2;
  (this->_name)._M_dataplus._M_p = (pointer)paVar1;
  if (local_60 == &local_50) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_4f,local_50);
    *(undefined8 *)((long)&(this->_name).field_2 + 8) = uStack_48;
  }
  else {
    (this->_name)._M_dataplus._M_p = local_60;
    (this->_name).field_2._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
  }
  (this->_name)._M_string_length = local_58;
  local_58 = 0;
  local_50 = '\0';
  local_60 = &local_50;
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>
  ::vector<std::shared_ptr<spdlog::sinks::sink>const*,void>
            ((vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>
              *)&this->_sinks,sinks_list._M_array,sinks_list._M_array + sinks_list._M_len,
             (allocator_type *)&local_40);
  local_40.this = (logger *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<spdlog::pattern_formatter,std::allocator<spdlog::pattern_formatter>,char_const(&)[3]>
            (&local_38,(pattern_formatter **)&local_40,
             (allocator<spdlog::pattern_formatter> *)&local_61,(char (*) [3])"%+");
  _Var3._M_pi = local_38._M_pi;
  (this->_formatter).super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_40.this;
  (this->_formatter).super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_formatter).super___shared_ptr<spdlog::formatter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  this->_level = (__atomic_base<int>)0x2;
  this->_flush_level = (__atomic_base<int>)0x6;
  *(undefined8 *)&(this->_err_handler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_err_handler).super__Function_base._M_functor + 8) = 0;
  (this->_err_handler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_err_handler)._M_invoker = (_Invoker_type)0x0;
  (this->_last_err_time).super___atomic_base<long>._M_i = 0;
  (this->_msg_counter).super___atomic_base<unsigned_long>._M_i = 1;
  local_40.this = this;
  std::function<void(std::__cxx11::string_const&)>::operator=
            ((function<void(std::__cxx11::string_const&)> *)&this->_err_handler,&local_40);
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  return;
}

Assistant:

inline spdlog::logger::logger(const std::string &logger_name, sinks_init_list sinks_list)
    : logger(logger_name, sinks_list.begin(), sinks_list.end())
{
}